

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O3

void __thiscall
OpenMD::AngleR::AngleR
          (AngleR *this,SimInfo *info,string *filename,string *sele1,RealType len,int nrbins)

{
  SelectionEvaluator *this_00;
  pointer pcVar1;
  long *plVar2;
  ostream *this_01;
  OpenMDBitSet *pOVar3;
  long lVar4;
  string paramString;
  stringstream params;
  string local_1f8;
  SelectionEvaluator *local_1d8;
  SelectionManager *local_1d0;
  SelectionManager *local_1c8;
  string *local_1c0;
  undefined1 local_1b8 [16];
  OpenMDBitSet local_1a8 [2];
  ios_base local_138 [264];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nrbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__AngleR_00335cd0;
  this->doVect_ = true;
  this->doOffset_ = false;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)&(this->selectionScript1_).field_2;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript1_,pcVar1,pcVar1 + sele1->_M_string_length);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_string_length = 0;
  (this->selectionScript2_).field_2._M_local_buf[0] = '\0';
  local_1c8 = &this->seleMan1_;
  local_1c0 = &this->selectionScript1_;
  SelectionManager::SelectionManager(local_1c8,info);
  local_1d0 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_1d0,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_1d8 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(local_1d8,info);
  this->len_ = len;
  this->nRBins_ = nrbins;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->avgAngleR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    lVar4 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar4),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  this->deltaR_ = this->len_ / (double)this->nRBins_;
  std::vector<double,_std::allocator<double>_>::resize(&this->histogram_,(long)this->nRBins_);
  std::vector<int,_std::allocator<int>_>::resize(&this->count_,(long)this->nRBins_);
  std::vector<double,_std::allocator<double>_>::resize(&this->avgAngleR_,(long)this->nRBins_);
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"radial density function Angle(r)","");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  getPrefix(&local_1f8,filename);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  pOVar3 = (OpenMDBitSet *)(plVar2 + 2);
  if ((OpenMDBitSet *)*plVar2 == pOVar3) {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar3->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._8_8_ = plVar2[3];
    local_1b8._0_8_ = local_1a8;
  }
  else {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar3->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1b8._0_8_ = (OpenMDBitSet *)*plVar2;
  }
  local_1b8._8_8_ = plVar2[1];
  *plVar2 = (long)pOVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," len = ",7);
  this_01 = std::ostream::_M_insert<double>(this->len_);
  std::__ostream_insert<char,std::char_traits<char>>(this_01,", nrbins = ",0xb);
  std::ostream::operator<<((ostream *)this_01,this->nRBins_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

AngleR::AngleR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, RealType len, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      doVect_(true), doOffset_(false), selectionScript1_(sele1),
      seleMan1_(info), seleMan2_(info), evaluator1_(info), evaluator2_(info),
      len_(len), nRBins_(nrbins) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    deltaR_ = len_ / nRBins_;

    histogram_.resize(nRBins_);
    count_.resize(nRBins_);
    avgAngleR_.resize(nRBins_);

    setAnalysisType("radial density function Angle(r)");
    setOutputName(getPrefix(filename) + ".AngleR");
    std::stringstream params;
    params << " len = " << len_ << ", nrbins = " << nRBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }